

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O3

BIO * BIO_find_type(BIO *b,int bio_type)

{
  uint uVar1;
  
  if (b != (BIO *)0x0) {
    do {
      if (b->method != (BIO_METHOD *)0x0) {
        uVar1 = b->method->type;
        if ((char)bio_type == '\0') {
          if ((uVar1 & bio_type) != 0) {
            return b;
          }
        }
        else if (uVar1 == bio_type) {
          return b;
        }
      }
      b = (BIO *)b->ptr;
    } while (b != (BIO *)0x0);
  }
  return (BIO *)0x0;
}

Assistant:

BIO *BIO_find_type(BIO *bio, int type) {
  int method_type, mask;

  if (!bio) {
    return NULL;
  }
  mask = type & 0xff;

  do {
    if (bio->method != NULL) {
      method_type = bio->method->type;

      if (!mask) {
        if (method_type & type) {
          return bio;
        }
      } else if (method_type == type) {
        return bio;
      }
    }
    bio = bio->next_bio;
  } while (bio != NULL);

  return NULL;
}